

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O3

bool __thiscall
SGParser::Parse<SGParser::Generator::RegExprDFAParseElement>::Create
          (Parse<SGParser::Generator::RegExprDFAParseElement> *this,ParseTable *ptable,
          size_t stackSize)

{
  uint uVar1;
  size_t *psVar2;
  RegExprDFAParseElement *pRVar3;
  RegExprDFAParseElement *pRVar4;
  size_t sVar5;
  
  uVar1 = this->TopState;
  if (uVar1 == 0xffffffff) {
    sVar5 = 0x80;
    if (0x80 < stackSize) {
      sVar5 = stackSize;
    }
    pRVar3 = (RegExprDFAParseElement *)
             operator_new__(-(ulong)(stackSize >> 0x3b != 0) | sVar5 * 0x20);
    pRVar4 = pRVar3;
    do {
      (pRVar4->super_ParseStackElement<SGParser::Generator::RegExprParseToken>).State = 0xffffffff;
      (pRVar4->super_ParseStackElement<SGParser::Generator::RegExprParseToken>).TerminalMarker =
           0xffffffffffffffff;
      pRVar4->DataType = Null;
      (pRVar4->field_1).ch = 0;
      pRVar4 = pRVar4 + 1;
    } while (pRVar4 != pRVar3 + sVar5);
    psVar2 = this->pValidTokenStackPositions;
    this->pValidTokenStackPositions = (size_t *)0x0;
    if (psVar2 != (size_t *)0x0) {
      operator_delete__(psVar2);
    }
    this->pParseTable = ptable;
    this->pTokenizer = (TokenStream<SGParser::Generator::RegExprParseToken> *)0x0;
    this->TopState = 0xffffffff;
    this->ErrorMarker = 0xffffffffffffffff;
    pRVar4 = this->pStack;
    this->pStack = pRVar3;
    if (pRVar4 != (RegExprDFAParseElement *)0x0) {
      operator_delete__(pRVar4);
    }
    this->StackSize = sVar5;
    this->StackPosition = 0;
  }
  return uVar1 == 0xffffffff;
}

Assistant:

bool Parse<StackElement>::Create(const ParseTable* ptable, size_t stackSize) {
    // Make sure the parsing process is not started
    // IsValid() is reversed in this context: `this` is valid for Create
    // only if IsValid() is false
    if (IsValid())
        return false;

    // Allocate stack
    // Basic exception safety is provided
    const auto newStackSize = std::max(MinStackSize, stackSize);
    auto       newStack     = new StackElement[newStackSize];

    // From this point we can (safely) initialize the actual data

    delete[] std::exchange(pValidTokenStackPositions, nullptr);

    pParseTable = ptable;
    pTokenizer  = nullptr;
    TopState    = InvalidState;
    ErrorMarker = InvalidIndex;

    // If new stack allocation is successful then modify the existing stack
    delete[] std::exchange(pStack, newStack);
    StackSize     = newStackSize;
    StackPosition = 0u;

    return true;
}